

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O0

void add(uint8_t *out,size_t nout,uint8_t *in,size_t nin)

{
  int local_34;
  int local_30;
  int ii;
  int oi;
  uint16_t carry;
  size_t nin_local;
  uint8_t *in_local;
  size_t nout_local;
  uint8_t *out_local;
  
  if (nout < nin) {
    abort();
  }
  ii._2_2_ = 0;
  local_30 = (int)nout;
  local_34 = (int)nin;
  while (local_30 = local_30 + -1, local_34 = local_34 + -1, -1 < local_30) {
    ii._2_2_ = ii._2_2_ + out[local_30];
    if (-1 < local_34) {
      ii._2_2_ = ii._2_2_ + in[local_34];
    }
    out[local_30] = (uint8_t)ii._2_2_;
    ii._2_2_ = ii._2_2_ >> 8;
  }
  return;
}

Assistant:

static void add(uint8_t *out, size_t nout, const uint8_t *in, size_t nin)
{
  assert(nout >= nin);

  uint16_t carry = 0;
  int oi, ii;

  for (oi = nout - 1, ii = nin - 1;
       oi >= 0;
       ii--, oi--)
  {
    carry += out[oi];
    if (ii >= 0)
      carry += in[ii];
    out[oi] = carry & 0xff;
    carry >>= 8;
  }
}